

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sglrReferenceContext.cpp
# Opt level: O1

bool sglr::isValidBufferTarget(deUint32 target)

{
  if ((int)target < 0x8a11) {
    if ((1 < target - 0x8892) && (1 < target - 0x88eb)) {
      return false;
    }
  }
  else if ((((9 < target - 0x8f36) || ((0x203U >> (target - 0x8f36 & 0x1f) & 1) == 0)) &&
           (target != 0x8a11)) && (target != 0x8c8e)) {
    return false;
  }
  return true;
}

Assistant:

static bool isValidBufferTarget (deUint32 target)
{
	switch (target)
	{
		case GL_ARRAY_BUFFER:
		case GL_COPY_READ_BUFFER:
		case GL_COPY_WRITE_BUFFER:
		case GL_DRAW_INDIRECT_BUFFER:
		case GL_ELEMENT_ARRAY_BUFFER:
		case GL_PIXEL_PACK_BUFFER:
		case GL_PIXEL_UNPACK_BUFFER:
		case GL_TRANSFORM_FEEDBACK_BUFFER:
		case GL_UNIFORM_BUFFER:
			return true;

		default:
			return false;
	}
}